

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.cpp
# Opt level: O1

SRes crnlib::LzmaEnc_Encode
               (CLzmaEncHandle pp,ISeqOutStream *outStream,ISeqInStream *inStream,
               ICompressProgress *progress,ISzAlloc *alloc,ISzAlloc *allocBig)

{
  int iVar1;
  SRes SVar2;
  CLzmaEnc *p;
  
  *(ISeqInStream **)((long)pp + 0x3d358) = inStream;
  *(ISeqOutStream **)((long)pp + 0x3d318) = outStream;
  iVar1 = LzmaEnc_AllocAndInit((CLzmaEnc *)pp,0,alloc,allocBig);
  if (iVar1 == 0) {
    iVar1 = LzmaEnc_CodeOneBlock((CLzmaEnc *)pp,0,0,0);
    while (iVar1 == 0) {
      if (*(int *)((long)pp + 0x3d344) != 0) {
        return 0;
      }
      if ((progress != (ICompressProgress *)0x0) &&
         (SVar2 = (*progress->Progress)
                            (progress,*(UInt64 *)((long)pp + 0x3d338),
                             ((*(long *)((long)pp + 0x3d320) + *(long *)((long)pp + 0x3d300)) -
                             *(long *)((long)pp + 0x3d310)) + *(long *)((long)pp + 0x3d2f8)),
         SVar2 != 0)) {
        return 10;
      }
      iVar1 = LzmaEnc_CodeOneBlock((CLzmaEnc *)pp,0,0,0);
    }
  }
  return iVar1;
}

Assistant:

SRes LzmaEnc_Encode(CLzmaEncHandle pp, ISeqOutStream* outStream, ISeqInStream* inStream, ICompressProgress* progress,
                    ISzAlloc* alloc, ISzAlloc* allocBig) {
  CLzmaEnc* p = (CLzmaEnc*)pp;
  SRes res = SZ_OK;

#ifdef COMPRESS_MF_MT
  Byte allocaDummy[0x300];
  (void)allocaDummy;
  int i = 0;
  for (i = 0; i < 16; i++)
    allocaDummy[i] = (Byte)i;
#endif

  RINOK(LzmaEnc_Prepare(pp, inStream, outStream, alloc, allocBig));

  for (;;) {
    res = LzmaEnc_CodeOneBlock(p, False, 0, 0);
    if (res != SZ_OK || p->finished != 0)
      break;
    if (progress != 0) {
      res = progress->Progress(progress, p->nowPos64, RangeEnc_GetProcessed(&p->rc));
      if (res != SZ_OK) {
        res = SZ_ERROR_PROGRESS;
        break;
      }
    }
  }
  LzmaEnc_Finish(pp);
  return res;
}